

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_get_legacy_signature_algorithm(uint16_t *out,EVP_PKEY *pkey)

{
  int iVar1;
  EVP_PKEY *pkey_local;
  uint16_t *out_local;
  
  iVar1 = EVP_PKEY_id((EVP_PKEY *)pkey);
  if (iVar1 == 6) {
    *out = 0xff01;
    out_local._7_1_ = true;
  }
  else if (iVar1 == 0x198) {
    *out = 0x203;
    out_local._7_1_ = true;
  }
  else {
    out_local._7_1_ = false;
  }
  return out_local._7_1_;
}

Assistant:

bool tls1_get_legacy_signature_algorithm(uint16_t *out, const EVP_PKEY *pkey) {
  switch (EVP_PKEY_id(pkey)) {
    case EVP_PKEY_RSA:
      *out = SSL_SIGN_RSA_PKCS1_MD5_SHA1;
      return true;
    case EVP_PKEY_EC:
      *out = SSL_SIGN_ECDSA_SHA1;
      return true;
    default:
      return false;
  }
}